

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int json_next_token(JSParseState *s)

{
  byte bVar1;
  JSRuntime *pJVar2;
  int iVar3;
  JSAtom JVar4;
  ulong uVar5;
  uintptr_t sp;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  bool bVar11;
  JSValue JVar12;
  char local_d8 [8];
  char ident_buf [128];
  size_t local_50;
  char *local_48;
  char *buf;
  byte *local_38;
  
  if (&stack0xfffffffffffffff8 < (undefined1 *)s->ctx->rt->stack_limit) {
    js_parse_error(s,"stack overflow");
    return -1;
  }
  buf = (char *)&s->token;
  free_token(s,(JSToken *)buf);
  local_38 = s->buf_ptr;
  s->last_ptr = local_38;
  s->last_line_num = (s->token).line_num;
LAB_0012863a:
  iVar3 = s->line_num;
  (s->token).line_num = iVar3;
  (s->token).ptr = local_38;
  bVar1 = *local_38;
  uVar9 = (ulong)bVar1;
  switch(uVar9) {
  case 0:
    if (local_38 < s->buf_end) {
LAB_00128929:
      *(uint *)buf = (uint)bVar1;
      local_38 = local_38 + 1;
    }
    else {
      buf[0] = -0x56;
      buf[1] = -1;
      buf[2] = -1;
      buf[3] = -1;
    }
LAB_00128833:
    s->buf_ptr = local_38;
    return 0;
  default:
    if (-1 < (char)bVar1) goto LAB_00128929;
    pcVar6 = "unexpected character";
LAB_00128849:
    js_parse_error(s,pcVar6);
    goto LAB_001288f1;
  case 9:
  case 0x20:
    goto switchD_00128659_caseD_9;
  case 10:
    goto switchD_00128659_caseD_a;
  case 0xb:
  case 0xc:
    if (s->ext_json == 0) goto LAB_00128929;
switchD_00128659_caseD_9:
    local_38 = local_38 + 1;
    goto LAB_0012863a;
  case 0xd:
    if (local_38[1] == 10) {
      local_38 = local_38 + 1;
    }
switchD_00128659_caseD_a:
    local_38 = local_38 + 1;
    s->line_num = iVar3 + 1;
    goto LAB_0012863a;
  case 0x22:
    iVar3 = 0x22;
    goto LAB_00128868;
  case 0x24:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
    pbVar10 = local_38 + 1;
    local_48 = local_d8;
    local_50 = 0x80;
    uVar7 = 0;
    local_38 = pbVar10;
    do {
      pcVar6 = local_48;
      uVar5 = local_50 - 6;
      do {
        pcVar6[uVar7] = (char)uVar9;
        uVar8 = (uint)(char)*pbVar10;
        uVar9 = (ulong)uVar8;
        if (((int)uVar8 < 0) ||
           ((lre_id_continue_table_ascii[(uVar9 & 0xff) >> 5] >> (uVar8 & 0x1f) & 1) == 0)) {
          JVar4 = JS_NewAtomLen(s->ctx,pcVar6,uVar7 + 1);
          goto LAB_00128802;
        }
        uVar7 = uVar7 + 1;
        pbVar10 = pbVar10 + 1;
      } while (uVar7 < uVar5);
      iVar3 = ident_realloc(s->ctx,&local_48,&local_50,local_d8);
    } while (iVar3 == 0);
    JVar4 = 0;
LAB_00128802:
    if (local_48 != local_d8) {
      pJVar2 = s->ctx->rt;
      (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,local_48);
    }
    if (JVar4 != 0) {
      (s->token).u.ident.atom = JVar4;
      *(undefined8 *)((long)&(s->token).u.str.str.u + 4) = 0;
      (s->token).val = -0x7d;
      local_38 = pbVar10;
      goto LAB_00128833;
    }
LAB_001288f1:
    buf[0] = -0x58;
    buf[1] = -1;
    buf[2] = -1;
    buf[3] = -1;
    return -1;
  case 0x27:
    if (s->ext_json == 0) goto LAB_00128929;
    iVar3 = 0x27;
LAB_00128868:
    iVar3 = js_parse_string(s,iVar3,1,local_38 + 1,(JSToken *)buf,&local_38);
    if (iVar3 != 0) goto LAB_001288f1;
    goto LAB_00128833;
  case 0x2b:
    if (s->ext_json != 0) goto switchD_00128659_caseD_2d;
    goto LAB_00128929;
  case 0x2d:
switchD_00128659_caseD_2d:
    if (local_38[1] - 0x3a < 0xfffffff6) goto LAB_00128929;
    break;
  case 0x2f:
    if (s->ext_json != 0) goto code_r0x00128693;
    goto LAB_00128929;
  case 0x30:
    if (0xfffffff5 < local_38[1] - 0x3a) goto LAB_00128929;
    break;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    break;
  }
  bVar11 = s->ext_json != 0;
  iVar3 = 10;
  if (bVar11) {
    iVar3 = 0;
  }
  JVar12 = js_atof(s->ctx,(char *)local_38,(char **)&local_38,iVar3,(uint)bVar11 << 2);
  if ((int)JVar12.tag == 6) goto LAB_001288f1;
  (s->token).val = -0x80;
  (s->token).u.str.str = JVar12;
  goto LAB_00128833;
code_r0x00128693:
  if (local_38[1] == 0x2f) {
    local_38 = local_38 + 2;
LAB_00128707:
    bVar1 = *local_38;
    if (bVar1 == 0) {
      if (local_38 < s->buf_end) goto LAB_00128759;
    }
    else if ((bVar1 != 10) && (bVar1 != 0xd)) {
      if (-1 < (char)bVar1) goto LAB_00128759;
      uVar8 = unicode_from_utf8(local_38,6,&local_38);
      if ((uVar8 & 0xfffffffe) != 0x2028) goto code_r0x00128748;
    }
    goto LAB_0012863a;
  }
  if (local_38[1] != 0x2a) goto LAB_00128929;
  local_38 = local_38 + 2;
LAB_001286ae:
  bVar1 = *local_38;
  if (bVar1 != 0x2a) {
    if (bVar1 == 10) {
      s->line_num = s->line_num + 1;
      goto LAB_001286fa;
    }
    if (bVar1 == 0xd) goto LAB_001286fa;
    if (bVar1 != 0) goto code_r0x001286c5;
    if (local_38 < s->buf_end) goto LAB_001286fa;
    pcVar6 = "unexpected end of comment";
    goto LAB_00128849;
  }
  if (local_38[1] != 0x2f) goto LAB_001286fa;
  local_38 = local_38 + 2;
  goto LAB_0012863a;
code_r0x00128748:
  if (uVar8 == 0xffffffff) {
LAB_00128759:
    local_38 = local_38 + 1;
  }
  goto LAB_00128707;
code_r0x001286c5:
  if ((-1 < (char)bVar1) || (iVar3 = unicode_from_utf8(local_38,6,&local_38), iVar3 == -1)) {
LAB_001286fa:
    local_38 = local_38 + 1;
  }
  goto LAB_001286ae;
}

Assistant:

static __exception int json_next_token(JSParseState *s)
{
    const uint8_t *p;
    int c;
    JSAtom atom;
    
    if (js_check_stack_overflow(s->ctx->rt, 0)) {
        return js_parse_error(s, "stack overflow");
    }
    
    free_token(s, &s->token);

    p = s->last_ptr = s->buf_ptr;
    s->last_line_num = s->token.line_num;
 redo:
    s->token.line_num = s->line_num;
    s->token.ptr = p;
    c = *p;
    switch(c) {
    case 0:
        if (p >= s->buf_end) {
            s->token.val = TOK_EOF;
        } else {
            goto def_token;
        }
        break;
    case '\'':
        if (!s->ext_json) {
            /* JSON does not accept single quoted strings */
            goto def_token;
        }
        /* fall through */
    case '\"':
        if (js_parse_string(s, c, TRUE, p + 1, &s->token, &p))
            goto fail;
        break;
    case '\r':  /* accept DOS and MAC newline sequences */
        if (p[1] == '\n') {
            p++;
        }
        /* fall thru */
    case '\n':
        p++;
        s->line_num++;
        goto redo;
    case '\f':
    case '\v':
        if (!s->ext_json) {
            /* JSONWhitespace does not match <VT>, nor <FF> */
            goto def_token;
        }
        /* fall through */
    case ' ':
    case '\t':
        p++;
        goto redo;
    case '/':
        if (!s->ext_json) {
            /* JSON does not accept comments */
            goto def_token;
        }
        if (p[1] == '*') {
            /* comment */
            p += 2;
            for(;;) {
                if (*p == '\0' && p >= s->buf_end) {
                    js_parse_error(s, "unexpected end of comment");
                    goto fail;
                }
                if (p[0] == '*' && p[1] == '/') {
                    p += 2;
                    break;
                }
                if (*p == '\n') {
                    s->line_num++;
                    p++;
                } else if (*p == '\r') {
                    p++;
                } else if (*p >= 0x80) {
                    c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
                    if (c == -1) {
                        p++; /* skip invalid UTF-8 */
                    }
                } else {
                    p++;
                }
            }
            goto redo;
        } else if (p[1] == '/') {
            /* line comment */
            p += 2;
            for(;;) {
                if (*p == '\0' && p >= s->buf_end)
                    break;
                if (*p == '\r' || *p == '\n')
                    break;
                if (*p >= 0x80) {
                    c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
                    /* LS or PS are considered as line terminator */
                    if (c == CP_LS || c == CP_PS) {
                        break;
                    } else if (c == -1) {
                        p++; /* skip invalid UTF-8 */
                    }
                } else {
                    p++;
                }
            }
            goto redo;
        } else {
            goto def_token;
        }
        break;
    case 'a': case 'b': case 'c': case 'd':
    case 'e': case 'f': case 'g': case 'h':
    case 'i': case 'j': case 'k': case 'l':
    case 'm': case 'n': case 'o': case 'p':
    case 'q': case 'r': case 's': case 't':
    case 'u': case 'v': case 'w': case 'x':
    case 'y': case 'z': 
    case 'A': case 'B': case 'C': case 'D':
    case 'E': case 'F': case 'G': case 'H':
    case 'I': case 'J': case 'K': case 'L':
    case 'M': case 'N': case 'O': case 'P':
    case 'Q': case 'R': case 'S': case 'T':
    case 'U': case 'V': case 'W': case 'X':
    case 'Y': case 'Z': 
    case '_':
    case '$':
        /* identifier : only pure ascii characters are accepted */
        p++;
        atom = json_parse_ident(s, &p, c);
        if (atom == JS_ATOM_NULL)
            goto fail;
        s->token.u.ident.atom = atom;
        s->token.u.ident.has_escape = FALSE;
        s->token.u.ident.is_reserved = FALSE;
        s->token.val = TOK_IDENT;
        break;
    case '+':
        if (!s->ext_json || !is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '0':
        if (is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '-':
        if (!is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8':
    case '9': 
        /* number */
    parse_number:
        {
            JSValue ret;
            int flags, radix;
            if (!s->ext_json) {
                flags = 0;
                radix = 10;
            } else {
                flags = ATOD_ACCEPT_BIN_OCT;
                radix = 0;
            }
            ret = js_atof(s->ctx, (const char *)p, (const char **)&p, radix,
                          flags);
            if (JS_IsException(ret))
                goto fail;
            s->token.val = TOK_NUMBER;
            s->token.u.num.val = ret;
        }
        break;
    default:
        if (c >= 128) {
            js_parse_error(s, "unexpected character");
            goto fail;
        }
    def_token:
        s->token.val = c;
        p++;
        break;
    }
    s->buf_ptr = p;

    //    dump_token(s, &s->token);
    return 0;

 fail:
    s->token.val = TOK_ERROR;
    return -1;
}